

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::apply_predicate
          (xpath_ast_node *this,xpath_node_set_raw *ns,size_t first,xpath_stack *stack,bool once)

{
  xpath_ast_node *this_00;
  xml_attribute_struct *pxVar1;
  bool bVar2;
  ulong uVar3;
  size_t sVar4;
  xpath_node *pxVar5;
  xpath_node *it;
  xpath_node *pxVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  xpath_context c;
  xpath_context local_58;
  
  pxVar5 = ns->_begin;
  uVar3 = (long)ns->_end - (long)pxVar5 >> 4;
  if (uVar3 != first) {
    if ((this->_type & 0xfeU) != 0x10) {
      __assert_fail("_type == ast_filter || _type == ast_predicate",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                    ,0x25f9,
                    "void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate(xpath_node_set_raw &, size_t, const xpath_stack &, bool)"
                   );
    }
    this_00 = this->_right;
    if ((this->_test & 0xfeU) == 2) {
      sVar4 = uVar3 - first;
      if (uVar3 < first) {
        __assert_fail("ns.size() >= first",
                      "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                      ,0x25db,
                      "static void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate_number_const(xpath_node_set_raw &, size_t, xpath_ast_node *, const xpath_stack &)"
                     );
      }
      if (this_00->_rettype != '\x02') {
        __assert_fail("expr->rettype() == xpath_type_number",
                      "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                      ,0x25dc,
                      "static void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate_number_const(xpath_node_set_raw &, size_t, xpath_ast_node *, const xpath_stack &)"
                     );
      }
      pxVar5 = pxVar5 + first;
      xpath_node::xpath_node(&local_58.n);
      local_58.position = 1;
      local_58.size = sVar4;
      dVar7 = eval_number(this_00,&local_58,stack);
      if ((1.0 <= dVar7) &&
         (auVar8._8_4_ = (int)(sVar4 >> 0x20), auVar8._0_8_ = sVar4, auVar8._12_4_ = 0x45300000,
         dVar7 <= (auVar8._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0))) {
        uVar3 = (long)(dVar7 - 9.223372036854776e+18) & (long)dVar7 >> 0x3f | (long)dVar7;
        auVar9._8_4_ = (int)(uVar3 >> 0x20);
        auVar9._0_8_ = uVar3;
        auVar9._12_4_ = 0x45300000;
        dVar11 = (auVar9._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
        if ((dVar7 == dVar11) && (!NAN(dVar7) && !NAN(dVar11))) {
          pxVar1 = pxVar5[uVar3 - 1]._attribute._attr;
          (pxVar5->_node)._root = pxVar5[uVar3 - 1]._node._root;
          (pxVar5->_attribute)._attr = pxVar1;
          pxVar5 = pxVar5 + 1;
        }
      }
      if ((pxVar5 < ns->_begin) || (ns->_end < pxVar5)) goto LAB_0019930d;
      ns->_end = pxVar5;
    }
    else if (this_00->_rettype == '\x02') {
      if (uVar3 < first) {
        __assert_fail("ns.size() >= first",
                      "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                      ,0x25c1,
                      "static void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate_number(xpath_node_set_raw &, size_t, xpath_ast_node *, const xpath_stack &, bool)"
                     );
      }
      pxVar5 = pxVar5 + first;
      if (pxVar5 != ns->_end) {
        sVar4 = 1;
        pxVar6 = pxVar5;
        do {
          local_58.n._node._root = (pxVar6->_node)._root;
          local_58.n._attribute._attr = (pxVar6->_attribute)._attr;
          local_58.position = sVar4;
          local_58.size = uVar3 - first;
          dVar7 = eval_number(this_00,&local_58,stack);
          auVar10._8_4_ = (int)(sVar4 >> 0x20);
          auVar10._0_8_ = sVar4;
          auVar10._12_4_ = 0x45300000;
          dVar11 = (auVar10._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0);
          if ((dVar7 != dVar11) || (NAN(dVar7) || NAN(dVar11))) {
            bVar2 = true;
          }
          else {
            pxVar1 = (pxVar6->_attribute)._attr;
            (pxVar5->_node)._root = (pxVar6->_node)._root;
            (pxVar5->_attribute)._attr = pxVar1;
            pxVar5 = pxVar5 + 1;
            bVar2 = !once;
          }
          if (!bVar2) break;
          pxVar6 = pxVar6 + 1;
          sVar4 = sVar4 + 1;
        } while (pxVar6 != ns->_end);
      }
      if ((pxVar5 < ns->_begin) || (ns->_end < pxVar5)) {
LAB_0019930d:
        __assert_fail("_begin <= pos && pos <= _end",
                      "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                      ,0x22b1,
                      "void pugi::impl::(anonymous namespace)::xpath_node_set_raw::truncate(xpath_node *)"
                     );
      }
      ns->_end = pxVar5;
    }
    else {
      if (uVar3 < first) {
        __assert_fail("ns.size() >= first",
                      "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                      ,0x25a7,
                      "static void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate_boolean(xpath_node_set_raw &, size_t, xpath_ast_node *, const xpath_stack &, bool)"
                     );
      }
      pxVar5 = pxVar5 + first;
      pxVar6 = pxVar5;
      if (pxVar5 != ns->_end) {
        sVar4 = 1;
        do {
          local_58.n._node._root = (pxVar5->_node)._root;
          local_58.n._attribute._attr = (pxVar5->_attribute)._attr;
          local_58.position = sVar4;
          local_58.size = uVar3 - first;
          bVar2 = eval_boolean(this_00,&local_58,stack);
          if (bVar2) {
            pxVar1 = (pxVar5->_attribute)._attr;
            (pxVar6->_node)._root = (pxVar5->_node)._root;
            (pxVar6->_attribute)._attr = pxVar1;
            pxVar6 = pxVar6 + 1;
          }
          if (bVar2 && once) break;
          pxVar5 = pxVar5 + 1;
          sVar4 = sVar4 + 1;
        } while (pxVar5 != ns->_end);
      }
      if ((pxVar6 < ns->_begin) || (ns->_end < pxVar6)) goto LAB_0019930d;
      ns->_end = pxVar6;
    }
  }
  return;
}

Assistant:

void apply_predicate(xpath_node_set_raw& ns, size_t first, const xpath_stack& stack, bool once)
		{
			if (ns.size() == first) return;

			assert(_type == ast_filter || _type == ast_predicate);

			if (_test == predicate_constant || _test == predicate_constant_one)
				apply_predicate_number_const(ns, first, _right, stack);
			else if (_right->rettype() == xpath_type_number)
				apply_predicate_number(ns, first, _right, stack, once);
			else
				apply_predicate_boolean(ns, first, _right, stack, once);
		}